

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::os::path::join_posix
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *paths)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string b;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  string *path;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(paths);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)empty_string_abi_cxx11_)
    ;
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paths);
    if (sVar2 == 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](paths,0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar3);
    }
    else {
      b.field_2._M_local_buf[0xf] = '\0';
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](paths,0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar3);
      for (b.field_2._8_4_ = 1; uVar4 = (ulong)(uint)b.field_2._8_4_,
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(paths), uVar4 < sVar2; b.field_2._8_4_ = b.field_2._8_4_ + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](paths,(ulong)(uint)b.field_2._8_4_);
        std::__cxx11::string::string((string *)local_40,(string *)pvVar3);
        bVar1 = startswith((string *)local_40,(string *)forward_slash_abi_cxx11_,0,0x7fffffff);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if (((uVar4 & 1) != 0) ||
             (bVar1 = endswith(__return_storage_ptr__,(string *)forward_slash_abi_cxx11_,0,
                               0x7fffffff), bVar1)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_40);
          }
          else {
            std::operator+(&local_70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           forward_slash_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
        std::__cxx11::string::~string((string *)local_40);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join_posix(const std::vector< std::string > & paths)
    {
        if(paths.empty()) return empty_string;
        if(paths.size() == 1) return paths[0];
        
        std::string path = paths[0];
        
        for(unsigned int i=1; i<paths.size(); ++i)
        {
            std::string b = paths[i];
            if(pystring::startswith(b, forward_slash))
            {
                path = b;
            }
            else if(path.empty() || pystring::endswith(path, forward_slash))
            {
                path += b;
            }
            else
            {
                path += forward_slash + b;
            }
        }
        
        return path;
    }